

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef BinaryenArrayLen(BinaryenModuleRef module,BinaryenExpressionRef ref)

{
  ArrayLen *pAVar1;
  Builder local_20;
  Expression *local_18;
  BinaryenExpressionRef ref_local;
  BinaryenModuleRef module_local;
  
  local_18 = ref;
  ref_local = (BinaryenExpressionRef)module;
  wasm::Builder::Builder(&local_20,module);
  pAVar1 = wasm::Builder::makeArrayLen(&local_20,local_18);
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenArrayLen(BinaryenModuleRef module,
                                       BinaryenExpressionRef ref) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeArrayLen((Expression*)ref));
}